

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O3

EC_T_BOOL __thiscall CEmNotification::DequeueJob(CEmNotification *this,PT_SLAVEJOBS pJob)

{
  PT_SLAVEJOBS p_Var1;
  PT_SLAVEJOBS p_Var2;
  EC_T_BOOL EVar3;
  PT_SLAVEJOBS p_Var4;
  
  EVar3 = 0;
  if ((pJob != (PT_SLAVEJOBS)0x0) &&
     (p_Var1 = (this->m_oSlaveJobQueue).pRead, EVar3 = 0, p_Var1 != (this->m_oSlaveJobQueue).pWrite)
     ) {
    memcpy(pJob,p_Var1,0x5ec);
    p_Var2 = (this->m_oSlaveJobQueue).pRead;
    p_Var1 = p_Var2 + 1;
    p_Var4 = (this->m_oSlaveJobQueue).Jobs;
    if (p_Var1 <= (this->m_oSlaveJobQueue).Jobs + 0x13) {
      p_Var4 = p_Var1;
    }
    if (p_Var2 == (PT_SLAVEJOBS)0x0) {
      p_Var4 = (PT_SLAVEJOBS)0x0;
    }
    (this->m_oSlaveJobQueue).pRead = p_Var4;
    EVar3 = 1;
  }
  return EVar3;
}

Assistant:

EC_T_BOOL CEmNotification::DequeueJob(
    PT_SLAVEJOBS    pJob    /**< [out]  Dequeued Job Object */
                                     )
{
    EC_T_BOOL bRet = EC_FALSE;

    if ((EC_NULL == pJob) || (m_oSlaveJobQueue.pRead == m_oSlaveJobQueue.pWrite))
    {
        goto Exit;
    }

    OsMemcpy(pJob, m_oSlaveJobQueue.pRead, sizeof(T_SLAVEJOBS));

    /* Increment Read Pointer */
    m_oSlaveJobQueue.pRead = IncrementJobPtr(m_oSlaveJobQueue.pRead);

    bRet = EC_TRUE;
Exit:
    return bRet;
}